

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

char ** cmsysSystem_Parse_CommandForUnix(char *command,int flags)

{
  byte c;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  char **__dest;
  ulong uVar6;
  undefined1 *puVar7;
  char **ppcVar8;
  char **__src;
  size_t __n;
  int buffer_size;
  char *buffer_begin;
  char *local_558;
  int pointers_size;
  char **local_548;
  char **pointer_begin;
  char *local_pointers [32];
  char local_buffer [1024];
  
  puVar7 = (undefined1 *)0x0;
  if (flags != 0) {
    return (char **)0x0;
  }
  pointers_size = 0x20;
  local_548 = local_pointers;
  buffer_size = 0x400;
  buffer_begin = local_buffer;
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  local_558 = buffer_begin;
  pointer_begin = local_548;
  while( true ) {
    c = *command;
    uVar6 = (ulong)c;
    if (uVar6 == 0) break;
    if (bVar1) {
LAB_00591b56:
      iVar4 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_558,&buffer_size,c);
      if (iVar4 == 0) goto LAB_00591c2e;
      bVar1 = false;
      puVar7 = &DAT_00000001;
    }
    else if (c == 0x5c) {
      bVar1 = true;
    }
    else if ((c != 0x27) || (bVar2)) {
      if (bVar3 || c != 0x22) {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + uVar6 * 2 + 1) & 0x20) == 0) goto LAB_00591b56;
        bVar1 = false;
        if ((int)puVar7 == 0) {
          puVar7 = (undefined1 *)0x0;
        }
        else {
          if (!bVar3 && !bVar2) {
            iVar4 = kwsysSystem__AppendArgument
                              (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                               &buffer_begin,&local_558,&buffer_size);
            if (iVar4 != 0) {
              puVar7 = (undefined1 *)0x0;
              bVar3 = false;
              goto LAB_00591b32;
            }
            goto LAB_00591c2e;
          }
          iVar4 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_558,&buffer_size,c);
          puVar7 = &DAT_00000001;
          if (iVar4 == 0) goto LAB_00591c2e;
        }
      }
      else {
        bVar2 = !bVar2;
        if (bVar2) {
          puVar7 = &DAT_00000001;
        }
        bVar1 = false;
        bVar3 = false;
      }
    }
    else {
      bVar3 = !bVar3;
      if (bVar3) {
        puVar7 = &DAT_00000001;
      }
LAB_00591b32:
      bVar1 = false;
      bVar2 = false;
    }
    command = (char *)((byte *)command + 1);
  }
  if ((int)puVar7 == 0) {
LAB_00591c84:
    __src = pointer_begin;
    ppcVar8 = local_548;
    __n = (long)local_548 - (long)pointer_begin;
    __dest = (char **)malloc(__n + 8);
    if (__dest != (char **)0x0) {
      memcpy(__dest,__src,__n);
      *(undefined8 *)((long)__dest + __n) = 0;
      goto LAB_00591caf;
    }
  }
  else {
LAB_00591c2e:
    iVar4 = kwsysSystem__AppendArgument
                      (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                       &buffer_begin,&local_558,&buffer_size);
    ppcVar8 = local_548;
    __src = pointer_begin;
    if ((uVar6 == 0) && (iVar4 != 0)) goto LAB_00591c84;
  }
  __dest = (char **)0x0;
  for (; ppcVar8 != __src; ppcVar8 = ppcVar8 + -1) {
    free(ppcVar8[-1]);
  }
LAB_00591caf:
  if (__src != local_pointers) {
    free(__src);
  }
  if (buffer_begin != local_buffer) {
    free(buffer_begin);
  }
  return __dest;
}

Assistant:

char** kwsysSystem_Parse_CommandForUnix(const char* command, int flags)
{
  /* Validate the flags.  */
  if (flags != 0) {
    return 0;
  }

  /* Forward to our internal implementation.  */
  return kwsysSystem__ParseUnixCommand(command, flags);
}